

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment_o1.cc
# Opt level: O0

VectorXd __thiscall lf::geometry::SegmentO1::IntegrationElement(SegmentO1 *this,MatrixXd *local)

{
  Index size;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_RDX;
  Index extraout_RDX;
  VectorXd VVar1;
  ConstColXpr local_128;
  ConstColXpr local_f0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>_>
  local_b8;
  RealScalar local_40;
  ConstantReturnType local_38;
  MatrixXd *local_local;
  SegmentO1 *this_local;
  
  local_local = local;
  this_local = this;
  size = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols(in_RDX);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::col
            (&local_f0,
             (DenseBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)
             &(local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_rows,1);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::col
            (&local_128,
             (DenseBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)
             &(local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_rows,0);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,2,0,-1,2>const,-1,1,true>>::operator-
            (&local_b8,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,2,0,_1,2>const,_1,1,true>> *)&local_f0
             ,(MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>_>
               *)&local_128);
  local_40 = Eigen::
             MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_-1,_1,_true>_>_>
             ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_2,_0,__1,_2>,__1,_1,_true>_>_>
                     *)&local_b8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Constant(&local_38,size,&local_40);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,_1,1,0,_1,1> *)this,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_38);
  VVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (VectorXd)VVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXd SegmentO1::IntegrationElement(
    const Eigen::MatrixXd& local) const {
  return Eigen::VectorXd::Constant(local.cols(),
                                   (coords_.col(1) - coords_.col(0)).norm());
}